

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

size_t path_length(archive_entry *entry)

{
  mode_t mVar1;
  char *__s;
  archive_entry *local_30;
  size_t len;
  char *path;
  mode_t type;
  archive_entry *entry_local;
  
  mVar1 = archive_entry_filetype(entry);
  __s = archive_entry_pathname(entry);
  if (__s == (char *)0x0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    local_30 = (archive_entry *)strlen(__s);
    if ((mVar1 == 0x4000) &&
       ((*__s == '\0' || (__s[(long)((long)&local_30[-1].ae_symlink_type + 3)] != '/')))) {
      local_30 = (archive_entry *)((long)&local_30->archive + 1);
    }
    entry_local = local_30;
  }
  return (size_t)entry_local;
}

Assistant:

static size_t
path_length(struct archive_entry *entry)
{
	mode_t type;
	const char *path;
	size_t len;

	type = archive_entry_filetype(entry);
	path = archive_entry_pathname(entry);

	if (path == NULL)
		return (0);
	len = strlen(path);
	if (type == AE_IFDIR && (path[0] == '\0' || path[len - 1] != '/'))
		++len; /* Space for the trailing / */
	return len;
}